

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e9e2::
ARTScanTest_scanForwardOneLeaf_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTScanTest_scanForwardOneLeaf_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  anon_class_24_3_5cb2cd47 fn_00;
  value_view v;
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  anon_class_24_3_5cb2cd47 fn;
  value_view visited_val;
  uint64_t visited_key;
  uint64_t n;
  TypeParam *db;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  string local_618;
  AssertHelper local_5f8;
  Message local_5f0;
  bool in_stack_fffffffffffffa1f;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffa20;
  AssertHelper local_5d0;
  Message local_5c8;
  int local_5bc;
  AssertionResult local_5b8;
  AssertHelper local_5a8;
  Message local_5a0;
  int local_594;
  AssertionResult local_590;
  unsigned_long *local_580;
  unsigned_long *puStack_578;
  qsbr_ptr_span<const_std::byte> *local_570;
  unsigned_long *local_568;
  unsigned_long *puStack_560;
  qsbr_ptr_span<const_std::byte> *local_558;
  qsbr_ptr_span<const_std::byte> local_550;
  unsigned_long local_540 [4];
  pointer local_520;
  size_t sStack_518;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *local_508;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1f);
  local_508 = unodb::test::
              tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
              ::get_db(&local_500);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  local_520 = pvVar2->_M_ptr;
  sStack_518 = (pvVar2->_M_extent)._M_extent_value;
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,0,v,false);
  local_540[1] = 0;
  local_540[0] = 0xffffffffffffffff;
  unodb::qsbr_ptr_span<const_std::byte>::qsbr_ptr_span(&local_550);
  local_580 = local_540 + 1;
  puStack_578 = local_540;
  fn_00.visited_key = puStack_578;
  fn_00.n = local_580;
  fn_00.visited_val = &local_550;
  local_570 = &local_550;
  local_568 = local_580;
  puStack_560 = puStack_578;
  local_558 = &local_550;
  unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
  scan<(anonymous_namespace)::ARTScanTest_scanForwardOneLeaf_Test<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>::TestBody()::_lambda(unodb::visitor<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::iterator>const&)_1_>
            ((olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)local_508,
             fn_00,true);
  local_594 = 1;
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)&local_590,"(1)","(n)",&local_594,local_540 + 1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5a0);
    pcVar3 = testing::AssertionResult::failure_message(&local_590);
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0xe0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    testing::Message::~Message(&local_5a0);
  }
  testing::AssertionResult::~AssertionResult(&local_590);
  local_5bc = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)&local_5b8,"(visited_key)","(0)",local_540,&local_5bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5b8);
  if (!bVar1) {
    testing::Message::Message(&local_5c8);
    pcVar3 = testing::AssertionResult::failure_message(&local_5b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0xe1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
    testing::internal::AssertHelper::~AssertHelper(&local_5d0);
    testing::Message::~Message(&local_5c8);
  }
  testing::AssertionResult::~AssertionResult(&local_5b8);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,0);
  std::ranges::__equal_fn::
  operator()<unodb::qsbr_ptr_span<const_std::byte>_&,_const_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
            ((__equal_fn *)&std::ranges::equal,&local_550,pvVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)&stack0xfffffffffffffa20,(bool *)&stack0xfffffffffffffa1f,
             (type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffa20);
  if (!bVar1) {
    testing::Message::Message(&local_5f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_618,(internal *)&stack0xfffffffffffffa20,
               (AssertionResult *)"std::ranges::equal(visited_val, unodb::test::test_values[0])",
               "false","true",in_R9);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_618);
    testing::internal::AssertHelper::AssertHelper
              (&local_5f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
               ,0xe3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5f8,&local_5f0);
    testing::internal::AssertHelper::~AssertHelper(&local_5f8);
    std::__cxx11::string::~string((string *)&local_618);
    testing::Message::~Message(&local_5f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&stack0xfffffffffffffa20);
  unodb::qsbr_ptr_span<const_std::byte>::~qsbr_ptr_span(&local_550);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanForwardOneLeaf) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  uint64_t n = 0;
  std::uint64_t visited_key{~0ULL};
  typename TypeParam::value_view visited_val{};
  const auto fn = [&n, &visited_key, &visited_val](
                      const unodb::visitor<typename TypeParam::iterator>&
                          v) noexcept(noexcept(v.get_key())) {
    n++;
    visited_key = decode(v.get_key());
    visited_val = v.get_value();
    return false;
  };
  db.scan(fn);
  UNODB_EXPECT_EQ(1, n);
  UNODB_EXPECT_EQ(visited_key, 0);
  UNODB_EXPECT_TRUE(
      std::ranges::equal(visited_val, unodb::test::test_values[0]));
}